

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

void __thiscall
FPathTraverse::AddThingIntercepts
          (FPathTraverse *this,int bx,int by,FBlockThingsIterator *it,bool compatible)

{
  double dVar1;
  intercept_t *piVar2;
  intercept_t *piVar3;
  uint uVar4;
  AActor *pAVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double den;
  
  FBlockThingsIterator::SwitchBlock(it,bx,by);
  pAVar5 = FBlockThingsIterator::Next(it,compatible);
  do {
    if (pAVar5 == (AActor *)0x0) {
      return;
    }
    if (compatible) {
      dVar8 = (this->trace).dx;
      dVar1 = (this->trace).dy;
      dVar11 = pAVar5->radius;
      dVar9 = -dVar11;
      if (dVar8 * dVar1 <= 0.0) {
        dVar9 = dVar11;
      }
      dVar10 = (pAVar5->__Pos).X;
      dVar14 = (pAVar5->__Pos).Y;
      dVar12 = dVar10 - dVar11;
      dVar10 = dVar10 + dVar11;
      dVar15 = (this->trace).x;
      dVar16 = (this->trace).y;
      uVar7 = -(ulong)(0.0 < dVar8 * dVar1);
      dVar13 = (double)(~uVar7 & (ulong)-dVar11 | (ulong)dVar11 & uVar7) + dVar14;
      dVar9 = dVar9 + dVar14;
      if (1.52587890625e-05 < (dVar15 - dVar12) * dVar1 + (dVar13 - dVar16) * dVar8 ==
          (dVar15 - dVar10) * dVar1 + (dVar9 - dVar16) * dVar8 <= 1.52587890625e-05) {
        dVar10 = dVar10 - dVar12;
        dVar9 = dVar9 - dVar13;
        dVar8 = dVar8 * dVar9 - dVar1 * dVar10;
        dVar11 = 0.0;
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          dVar11 = (dVar10 * (dVar16 - dVar13) + dVar9 * (dVar12 - dVar15)) / dVar8;
        }
        if (this->Startfrac <= dVar11) goto LAB_0041bc82;
      }
    }
    else {
      dVar11 = (this->trace).x;
      dVar8 = (this->trace).y;
      dVar9 = (this->trace).dx;
      dVar10 = (this->trace).dy;
      dVar1 = pAVar5->radius;
      dVar14 = dVar1 * -2.0;
      iVar6 = 0;
      uVar4 = 0;
      do {
        dVar15 = (pAVar5->__Pos).Y + dVar1;
        if (dVar15 <= dVar8) {
          dVar16 = (pAVar5->__Pos).X + dVar1;
          iVar6 = iVar6 + 1;
          if ((dVar11 - (dVar16 + dVar14)) * dVar10 + ((dVar15 + 0.0) - dVar8) * dVar9 <=
              1.52587890625e-05 ==
              1.52587890625e-05 < (dVar11 - dVar16) * dVar10 + (dVar15 - dVar8) * dVar9) {
            dVar12 = dVar9 * 0.0 - dVar14 * dVar10;
            dVar13 = 0.0;
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              dVar13 = ((dVar8 - dVar15) * dVar14 + (dVar16 - dVar11) * 0.0) / dVar12;
            }
            if (this->Startfrac <= dVar13) {
              TArray<intercept_t,_intercept_t>::Grow(&intercepts,1);
              piVar3 = intercepts.Array;
              uVar7 = (ulong)intercepts.Count;
              intercepts.Array[uVar7].frac = dVar13;
              piVar2 = piVar3 + uVar7;
              piVar2->isaline = false;
              piVar2->done = false;
              piVar3[uVar7].d.thing = pAVar5;
              intercepts.Count = intercepts.Count + 1;
              break;
            }
            if (0.0 < this->Startfrac) {
              (*(code *)(&DAT_006014a8 + *(int *)(&DAT_006014a8 + (ulong)uVar4 * 4)))();
              return;
            }
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 4);
      if (iVar6 == 0) {
        dVar11 = 0.0;
LAB_0041bc82:
        TArray<intercept_t,_intercept_t>::Grow(&intercepts,1);
        piVar3 = intercepts.Array;
        uVar7 = (ulong)intercepts.Count;
        intercepts.Array[uVar7].frac = dVar11;
        piVar2 = piVar3 + uVar7;
        piVar2->isaline = false;
        piVar2->done = false;
        piVar3[uVar7].d.thing = pAVar5;
        intercepts.Count = intercepts.Count + 1;
      }
    }
    pAVar5 = FBlockThingsIterator::Next(it,compatible);
  } while( true );
}

Assistant:

void FPathTraverse::AddThingIntercepts (int bx, int by, FBlockThingsIterator &it, bool compatible)
{
	AActor *thing;

	it.SwitchBlock(bx, by);
	while ((thing = it.Next(compatible)))
	{
		int numfronts = 0;
		divline_t line;
		int i;


		if (!compatible)
		{
			// [RH] Don't check a corner to corner crossection for hit.
			// Instead, check against the actual bounding box (but not if compatibility optioned.)

			// There's probably a smarter way to determine which two sides
			// of the thing face the trace than by trying all four sides...
			for (i = 0; i < 4; ++i)
			{
				switch (i)
				{
				case 0:		// Top edge
					line.y = thing->Y() + thing->radius;
					if (trace.y < line.y) continue;
					line.x = thing->X() + thing->radius;
					line.dx = -thing->radius * 2;
					line.dy = 0;
					break;

				case 1:		// Right edge
					line.x = thing->X() + thing->radius;
					if (trace.x < line.x) continue;
					line.y = thing->Y() - thing->radius;
					line.dx = 0;
					line.dy = thing->radius * 2;
					break;

				case 2:		// Bottom edge
					line.y = thing->Y() - thing->radius;
					if (trace.y > line.y) continue;
					line.x = thing->X() - thing->radius;
					line.dx = thing->radius * 2;
					line.dy = 0;
					break;

				case 3:		// Left edge
					line.x = thing->X() - thing->radius;
					if (trace.x > line.x) continue;
					line.y = thing->Y() + thing->radius;
					line.dx = 0;
					line.dy = thing->radius * -2;
					break;
				}
				// Check if this side is facing the trace origin
				numfronts++;

				// If it is, see if the trace crosses it
				if (P_PointOnDivlineSide (line.x, line.y, &trace) !=
					P_PointOnDivlineSide (line.x + line.dx, line.y + line.dy, &trace))
				{
					// It's a hit
					double frac = P_InterceptVector (&trace, &line);
					if (frac < Startfrac)
					{ // behind source
						if (Startfrac > 0)
						{
							// check if the trace starts within this actor
							switch (i)
							{
							case 0:
								line.y -= 2 * thing->radius;
								break;

							case 1:
								line.x -= 2 * thing->radius;
								break;

							case 2:
								line.y += 2 * thing->radius;
								break;

							case 3:
								line.x += 2 * thing->radius;
								break;
							}
							double frac2 = P_InterceptVector(&trace, &line);
							if (frac2 >= Startfrac) goto addit;
						}
						continue;
					}
				addit:
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
					break;
				}
			}

			// If none of the sides was facing the trace, then the trace
			// must have started inside the box, so add it as an intercept.
			if (numfronts == 0)
			{
				intercept_t newintercept;
				newintercept.frac = 0;
				newintercept.isaline = false;
				newintercept.done = false;
				newintercept.d.thing = thing;
				intercepts.Push (newintercept);
			}
		}
		else
		{
			// Old code for compatibility purposes
			double 		x1, y1, x2, y2;
			int 			s1, s2;
			divline_t		dl;
			double 		frac;
				
			bool tracepositive = (trace.dx * trace.dy)>0;
						
			// check a corner to corner crossection for hit
			if (tracepositive)
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() + thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() - thing->radius;					
			}
			else
			{
				x1 = thing->X() - thing->radius;
				y1 = thing->Y() - thing->radius;
						
				x2 = thing->X() + thing->radius;
				y2 = thing->Y() + thing->radius;					
			}
			
			s1 = P_PointOnDivlineSide (x1, y1, &trace);
			s2 = P_PointOnDivlineSide (x2, y2, &trace);

			if (s1 != s2)
			{
				dl.x = x1;
				dl.y = y1;
				dl.dx = x2-x1;
				dl.dy = y2-y1;
				
				frac = P_InterceptVector (&trace, &dl);

				if (frac >= Startfrac)
				{
					intercept_t newintercept;
					newintercept.frac = frac;
					newintercept.isaline = false;
					newintercept.done = false;
					newintercept.d.thing = thing;
					intercepts.Push (newintercept);
				}
			}
		}
	}
}